

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O0

void uv::TCPClient::ReconnectTimer(uv_timer_t *handle)

{
  CStringStream *pCVar1;
  ILog4zManager *pIVar2;
  undefined8 uVar3;
  long *in_FS_OFFSET;
  string local_168;
  undefined1 local_148 [8];
  CStringStream ss_4;
  undefined1 local_110 [8];
  CStringStream ss_3;
  undefined1 local_f0 [4];
  int iret_2;
  sockaddr_in bind_addr_1;
  undefined1 local_c0 [8];
  CStringStream ss_2;
  int iret_1;
  sockaddr_in6 bind_addr;
  sockaddr *pAddr;
  string local_70;
  undefined1 local_50 [8];
  CStringStream ss_1;
  undefined1 local_30 [4];
  int iret;
  CStringStream ss;
  TCPClient *theclass;
  uv_timer_t *handle_local;
  
  ss.m_pCur = (char *)handle->data;
  if ((ss.m_pCur[0x588] & 1U) == 0) {
    return;
  }
  zsummer::log4z::CStringStream::CStringStream
            ((CStringStream *)local_30,(char *)(*in_FS_OFFSET + -0x800),0x800);
  zsummer::log4z::CStringStream::operator<<((CStringStream *)local_30,"start reconnect...\n");
  pCVar1 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_30," ( ");
  pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ");
  pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ) : ");
  zsummer::log4z::CStringStream::operator<<(pCVar1,0x20e);
  pIVar2 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar2->_vptr_ILog4zManager[8])(pIVar2,0,1,*in_FS_OFFSET + -0x800);
  ss_1.m_pCur._4_4_ = uv_tcp_init(ss.m_pCur + 0x90,*(undefined8 *)(ss.m_pCur + 8));
  if (ss_1.m_pCur._4_4_ == 0) {
    **(undefined8 **)(ss.m_pCur + 8) = *(undefined8 *)(ss.m_pCur + 8);
    *(char **)(*(long *)(ss.m_pCur + 8) + 0x1d8) = ss.m_pCur;
    if ((ss.m_pCur[0x5bc] & 1U) == 0) {
      uVar3 = std::__cxx11::string::c_str();
      ss_3.m_pCur._4_4_ = uv_ip4_addr(uVar3,*(undefined4 *)(ss.m_pCur + 0x5b8),local_f0);
      if (ss_3.m_pCur._4_4_ != 0) {
        zsummer::log4z::CStringStream::CStringStream
                  ((CStringStream *)local_110,(char *)(*in_FS_OFFSET + -0x800),0x800);
        GetUVError_abi_cxx11_((string *)&ss_4.m_pCur,ss_3.m_pCur._4_4_);
        zsummer::log4z::CStringStream::operator<<((CStringStream *)local_110,(string *)&ss_4.m_pCur)
        ;
        std::__cxx11::string::~string((string *)&ss_4.m_pCur);
        pCVar1 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_110," ( ");
        pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ");
        pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ) : ");
        zsummer::log4z::CStringStream::operator<<(pCVar1,0x225);
        pIVar2 = zsummer::log4z::ILog4zManager::GetInstance();
        (*pIVar2->_vptr_ILog4zManager[8])(pIVar2,0,3,*in_FS_OFFSET + -0x800);
        uv_close(*(undefined8 *)(ss.m_pCur + 8),0);
        goto LAB_0011ad84;
      }
      bind_addr._20_8_ = local_f0;
    }
    else {
      uVar3 = std::__cxx11::string::c_str();
      ss_2.m_pCur._0_4_ =
           uv_ip6_addr(uVar3,*(undefined4 *)(ss.m_pCur + 0x5b8),
                       (undefined1 *)((long)&ss_2.m_pCur + 4));
      if ((int)ss_2.m_pCur != 0) {
        zsummer::log4z::CStringStream::CStringStream
                  ((CStringStream *)local_c0,(char *)(*in_FS_OFFSET + -0x800),0x800);
        GetUVError_abi_cxx11_((string *)bind_addr_1.sin_zero,(int)ss_2.m_pCur);
        zsummer::log4z::CStringStream::operator<<
                  ((CStringStream *)local_c0,(string *)bind_addr_1.sin_zero);
        std::__cxx11::string::~string((string *)bind_addr_1.sin_zero);
        pCVar1 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_c0," ( ");
        pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ");
        pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ) : ");
        zsummer::log4z::CStringStream::operator<<(pCVar1,0x21c);
        pIVar2 = zsummer::log4z::ILog4zManager::GetInstance();
        (*pIVar2->_vptr_ILog4zManager[8])(pIVar2,0,3,*in_FS_OFFSET + -0x800);
        uv_close(*(undefined8 *)(ss.m_pCur + 8),0);
        goto LAB_0011ad84;
      }
      bind_addr._20_8_ = (long)&ss_2.m_pCur + 4;
    }
    ss_1.m_pCur._4_4_ =
         uv_tcp_connect(ss.m_pCur + 0x3f0,*(undefined8 *)(ss.m_pCur + 8),bind_addr._20_8_,
                        AfterConnect);
    if (ss_1.m_pCur._4_4_ == 0) {
      return;
    }
    zsummer::log4z::CStringStream::CStringStream
              ((CStringStream *)local_148,(char *)(*in_FS_OFFSET + -0x800),0x800);
    GetUVError_abi_cxx11_(&local_168,ss_1.m_pCur._4_4_);
    zsummer::log4z::CStringStream::operator<<((CStringStream *)local_148,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    pCVar1 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_148," ( ");
    pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ");
    pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar1,0x22d);
    pIVar2 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar2->_vptr_ILog4zManager[8])(pIVar2,0,3,*in_FS_OFFSET + -0x800);
    uv_close(*(undefined8 *)(ss.m_pCur + 8),0);
  }
  else {
    zsummer::log4z::CStringStream::CStringStream
              ((CStringStream *)local_50,(char *)(*in_FS_OFFSET + -0x800),0x800);
    GetUVError_abi_cxx11_(&local_70,ss_1.m_pCur._4_4_);
    zsummer::log4z::CStringStream::operator<<((CStringStream *)local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pCVar1 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_50," ( ");
    pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ");
    pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar1,0x212);
    pIVar2 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar2->_vptr_ILog4zManager[8])(pIVar2,0,3,*in_FS_OFFSET + -0x800);
  }
LAB_0011ad84:
  uv_timer_stop(handle);
  *(long *)(ss.m_pCur + 0x590) = *(long *)(ss.m_pCur + 0x590) << 1;
  uv_timer_start(handle,ReconnectTimer,*(undefined8 *)(ss.m_pCur + 0x590),
                 *(undefined8 *)(ss.m_pCur + 0x590));
  return;
}

Assistant:

void TCPClient::ReconnectTimer(uv_timer_t* handle)
{
    TCPClient* theclass = (TCPClient*)handle->data;
    if (!theclass->isreconnecting_) {
        return;
    }
    LOGI("start reconnect...\n");
    do {
        int iret = uv_tcp_init(&theclass->loop_, &theclass->client_handle_->tcphandle);
        if (iret) {
            LOGE(GetUVError(iret));
            break;
        }
        theclass->client_handle_->tcphandle.data = theclass->client_handle_;
        theclass->client_handle_->parent_server = theclass;
        struct sockaddr* pAddr;
        if (theclass->isIPv6_) {
            struct sockaddr_in6 bind_addr;
            int iret = uv_ip6_addr(theclass->connectip_.c_str(), theclass->connectport_, &bind_addr);
            if (iret) {
                LOGE(GetUVError(iret));
                uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
                break;
            }
            pAddr = (struct sockaddr*)&bind_addr;
        } else {
            struct sockaddr_in bind_addr;
            int iret = uv_ip4_addr(theclass->connectip_.c_str(), theclass->connectport_, &bind_addr);
            if (iret) {
                LOGE(GetUVError(iret));
                uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
                break;
            }
            pAddr = (struct sockaddr*)&bind_addr;
        }
        iret = uv_tcp_connect(&theclass->connect_req_, &theclass->client_handle_->tcphandle, (const sockaddr*)pAddr, AfterConnect);
        if (iret) {
            LOGE(GetUVError(iret));
            uv_close((uv_handle_t*)&theclass->client_handle_->tcphandle, NULL);
            break;
        }
        return;
    } while (0);
    //reconnect failure, restart timer to trigger reconnect.
    uv_timer_stop(handle);
    theclass->repeat_time_ *= 2;
    uv_timer_start(handle, TCPClient::ReconnectTimer, theclass->repeat_time_, theclass->repeat_time_);
}